

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_tga.c
# Opt level: O2

int read_header_tga(gdIOCtx *ctx,oTga *tga)

{
  undefined1 auVar1 [14];
  undefined1 auVar2 [14];
  undefined1 auVar3 [14];
  unkbyte10 Var4;
  undefined1 auVar5 [14];
  int iVar6;
  char *buf;
  byte bVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  uchar header [18];
  
  iVar6 = gdGetBuf(header,0x12,ctx);
  if (iVar6 < 0x12) {
    gd_error("fail to read header");
    return -1;
  }
  tga->identsize = header[0];
  tga->colormaptype = header[1];
  tga->imagetype = header[2];
  uVar8 = (ulong)(CONCAT24(SUB42(header._3_4_,2),header._3_4_) & 0xffff0000ffff);
  tga->colormapstart = (int)uVar8;
  tga->colormaplength = (int)(uVar8 >> 0x20);
  tga->colormapbits = header[7];
  auVar1._8_4_ = 0;
  auVar1[0] = header[8];
  auVar1[1] = header[9];
  auVar1[2] = header[10];
  auVar1[3] = header[0xb];
  auVar1[4] = header[0xc];
  auVar1[5] = header[0xd];
  auVar1[6] = header[0xe];
  auVar1[7] = header[0xf];
  auVar1._12_2_ = SUB82(header._8_8_,6);
  auVar2._8_2_ = SUB82(header._8_8_,4);
  auVar2[0] = header[8];
  auVar2[1] = header[9];
  auVar2[2] = header[10];
  auVar2[3] = header[0xb];
  auVar2[4] = header[0xc];
  auVar2[5] = header[0xd];
  auVar2[6] = header[0xe];
  auVar2[7] = header[0xf];
  auVar2._10_4_ = auVar1._10_4_;
  auVar5._6_8_ = 0;
  auVar5._0_6_ = auVar2._8_6_;
  auVar3._4_2_ = SUB82(header._8_8_,2);
  auVar3._0_4_ = (uint)header._8_8_;
  auVar3._6_8_ = SUB148(auVar5 << 0x40,6);
  Var4 = auVar3._4_10_;
  auVar9._0_4_ = (uint)header._8_8_ & 0xffff;
  auVar9._4_10_ = Var4;
  auVar9._14_2_ = 0;
  tga->xstart = auVar9._0_4_;
  tga->ystart = (int)Var4;
  tga->width = (int)((unkuint10)Var4 >> 0x20);
  tga->height = auVar9._12_4_;
  tga->bits = header[0x10];
  bVar7 = header[0x11] & 0xf;
  tga->flipv = (header[0x11] & 0x20) == 0;
  tga->alphabits = bVar7;
  tga->fliph = header[0x11] >> 4 & 1;
  if (header[0x10] == ' ') {
    if (bVar7 == 8) goto LAB_0011d509;
  }
  else if ((header[0x10] == '\x18') && (bVar7 == 0)) {
LAB_0011d509:
    tga->ident = (char *)0x0;
    if ((ulong)header[0] == 0) {
      return 1;
    }
    buf = (char *)gdMalloc((ulong)header[0]);
    tga->ident = buf;
    if (buf == (char *)0x0) {
      return -1;
    }
    gdGetBuf(buf,(uint)tga->identsize,ctx);
    return 1;
  }
  gd_error_ex(4,"gd-tga: %u bits per pixel with %u alpha bits not supported\n");
  return -1;
}

Assistant:

int read_header_tga(gdIOCtx *ctx, oTga *tga)
{

	unsigned char header[18];

	if (gdGetBuf(header, sizeof(header), ctx) < 18) {
		gd_error("fail to read header");
		return -1;
	}

	tga->identsize = header[0];
	tga->colormaptype = header[1];
	tga->imagetype = header[2];
	tga->colormapstart = header[3] + (header[4] << 8);
	tga->colormaplength = header[5] + (header[6] << 8);
	tga->colormapbits = header[7];
	tga->xstart = header[8] + (header[9] << 8);
	tga->ystart = header[10] + (header[11] << 8);
	tga->width = header[12] + (header[13] << 8);
	tga->height = header[14] + (header[15] << 8);
	tga->bits = header[16];
	tga->alphabits = header[17] & 0x0f;
	tga->fliph = (header[17] & 0x10) ? 1 : 0;
	tga->flipv = (header[17] & 0x20) ? 0 : 1;

#if DEBUG
	printf("format bps: %i\n", tga->bits);
	printf("flip h/v: %i / %i\n", tga->fliph, tga->flipv);
	printf("alpha: %i\n", tga->alphabits);
	printf("wxh: %i %i\n", tga->width, tga->height);
#endif

	if (!((tga->bits == TGA_BPP_24 && tga->alphabits == 0)
		|| (tga->bits == TGA_BPP_32 && tga->alphabits == 8)))
	{
		gd_error_ex(GD_WARNING, "gd-tga: %u bits per pixel with %u alpha bits not supported\n",
			tga->bits, tga->alphabits);
		return -1;
	}

	tga->ident = NULL;

	if (tga->identsize > 0) {
		tga->ident = (char *) gdMalloc(tga->identsize * sizeof(char));
		if(tga->ident == NULL) {
			return -1;
		}

		gdGetBuf(tga->ident, tga->identsize, ctx);
	}

	return 1;
}